

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b10_sx_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 auVar6 [16];
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  
  auVar3 = pmovzxbw(in_XMM0,0xffffffffffffffff);
  auVar4 = pmovsxbw(in_XMM1,0x4040404040404040);
  do {
    uVar1 = *(undefined8 *)mask;
    uVar5 = (undefined1)((ulong)uVar1 >> 8);
    auVar6[0] = pavgb(uVar5,(char)uVar1);
    uVar7 = (undefined1)((ulong)uVar1 >> 0x10);
    auVar6[1] = pavgb(uVar7,uVar5);
    uVar5 = (undefined1)((ulong)uVar1 >> 0x18);
    auVar6[2] = pavgb(uVar5,uVar7);
    uVar7 = (undefined1)((ulong)uVar1 >> 0x20);
    auVar6[3] = pavgb(uVar7,uVar5);
    uVar5 = (undefined1)((ulong)uVar1 >> 0x28);
    auVar6[4] = pavgb(uVar5,uVar7);
    uVar7 = (undefined1)((ulong)uVar1 >> 0x30);
    auVar6[5] = pavgb(uVar7,uVar5);
    uVar5 = (undefined1)((ulong)uVar1 >> 0x38);
    auVar6[6] = pavgb(uVar5,uVar7);
    auVar6[7] = pavgb(0,uVar5);
    auVar6[8] = pavgb(0,0);
    auVar6[9] = pavgb(0,0);
    auVar6[10] = pavgb(0,0);
    auVar6[0xb] = pavgb(0,0);
    auVar6[0xc] = pavgb(0,0);
    auVar6[0xd] = pavgb(0,0);
    auVar6[0xe] = pavgb(0,0);
    auVar6[0xf] = pavgb(0,0);
    auVar6 = auVar6 & auVar3;
    uVar1 = *(undefined8 *)src0;
    uVar2 = *(undefined8 *)src1;
    uVar8 = pavgw((ushort)((short)uVar1 * auVar6._0_2_ +
                          (short)uVar2 * (auVar4._0_2_ - auVar6._0_2_)) >> 5,0);
    uVar9 = pavgw((ushort)((short)((ulong)uVar1 >> 0x10) * auVar6._2_2_ +
                          (short)((ulong)uVar2 >> 0x10) * (auVar4._2_2_ - auVar6._2_2_)) >> 5,0);
    uVar10 = pavgw((ushort)((short)((ulong)uVar1 >> 0x20) * auVar6._4_2_ +
                           (short)((ulong)uVar2 >> 0x20) * (auVar4._4_2_ - auVar6._4_2_)) >> 5,0);
    uVar11 = pavgw((ushort)((short)((ulong)uVar1 >> 0x30) * auVar6._6_2_ +
                           (short)((ulong)uVar2 >> 0x30) * (auVar4._6_2_ - auVar6._6_2_)) >> 5,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    *(ulong *)dst = CONCAT26(uVar11,CONCAT24(uVar10,CONCAT22(uVar9,uVar8)));
    mask = mask + mask_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_sx_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_sx_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                 src1_stride, mask, mask_stride, h,
                                 blend_4_b10);
}